

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O0

void printf_buf(TextBuffer *buf,char *format,...)

{
  char in_AL;
  char *str;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_2b0;
  long *local_298;
  double *local_280;
  double *local_260;
  lua_Integer *local_248;
  undefined8 *local_230;
  long *local_210;
  long *local_1f8;
  uint *local_1e0;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_110;
  void *p;
  lua_Integer i_1;
  double d;
  lua_Integer i;
  char *s_3;
  char *s_2;
  StringObject *s_1;
  VariableType *type;
  StringObject *s;
  char *pcStack_c0;
  int level;
  char *cp;
  va_list ap;
  char local_98 [8];
  char tbuf [128];
  char *format_local;
  TextBuffer *buf_local;
  
  if (in_AL != '\0') {
    local_198 = in_XMM0_Qa;
    local_188 = in_XMM1_Qa;
    local_178 = in_XMM2_Qa;
    local_168 = in_XMM3_Qa;
    local_158 = in_XMM4_Qa;
    local_148 = in_XMM5_Qa;
    local_138 = in_XMM6_Qa;
    local_128 = in_XMM7_Qa;
  }
  local_1b8 = in_RDX;
  local_1b0 = in_RCX;
  local_1a8 = in_R8;
  local_1a0 = in_R9;
  tbuf._120_8_ = format;
  memset(local_98,0,0x80);
  ap[0].overflow_arg_area = local_1c8;
  ap[0]._0_8_ = &stack0x00000008;
  cp._4_4_ = 0x30;
  cp._0_4_ = 0x10;
  for (pcStack_c0 = (char *)tbuf._120_8_; *pcStack_c0 != '\0'; pcStack_c0 = pcStack_c0 + 1) {
    if ((*pcStack_c0 == '%') && (pcStack_c0[1] == 'p')) {
      if ((uint)cp < 0x29) {
        local_1e0 = (uint *)((long)(int)(uint)cp + (long)ap[0].overflow_arg_area);
        cp._0_4_ = (uint)cp + 8;
      }
      else {
        local_1e0 = (uint *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      s._4_4_ = *local_1e0;
      snprintf(local_98,0x80,"%.*s",(ulong)s._4_4_,printf_buf::PADDING);
      raviX_buffer_add_string(buf,local_98);
      pcStack_c0 = pcStack_c0 + 1;
    }
    else if ((*pcStack_c0 == '%') && (pcStack_c0[1] == 't')) {
      if ((uint)cp < 0x29) {
        local_1f8 = (long *)((long)(int)(uint)cp + (long)ap[0].overflow_arg_area);
        cp._0_4_ = (uint)cp + 8;
      }
      else {
        local_1f8 = (long *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      type = (VariableType *)*local_1f8;
      raviX_buffer_add_string(buf,*(char **)(type + 1));
      pcStack_c0 = pcStack_c0 + 1;
    }
    else if ((*pcStack_c0 == '%') && (pcStack_c0[1] == 'T')) {
      if ((uint)cp < 0x29) {
        local_210 = (long *)((long)(int)(uint)cp + (long)ap[0].overflow_arg_area);
        cp._0_4_ = (uint)cp + 8;
      }
      else {
        local_210 = (long *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      s_1 = (StringObject *)*local_210;
      if (s_1->len == 0x401) {
        s_2 = *(char **)&s_1->hash;
        if (s_2 == (char *)0x0) {
          raviX_buffer_add_string(buf,"userdata");
        }
        else {
          raviX_buffer_add_string(buf,*(char **)(s_2 + 0x10));
        }
      }
      else {
        str = raviX_get_type_name(s_1->len);
        raviX_buffer_add_string(buf,str);
      }
      pcStack_c0 = pcStack_c0 + 1;
    }
    else if ((*pcStack_c0 == '%') && (pcStack_c0[1] == 's')) {
      if ((uint)cp < 0x29) {
        local_230 = (undefined8 *)((long)(int)(uint)cp + (long)ap[0].overflow_arg_area);
        cp._0_4_ = (uint)cp + 8;
      }
      else {
        local_230 = (undefined8 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      s_3 = (char *)*local_230;
      raviX_buffer_add_string(buf,s_3);
      pcStack_c0 = pcStack_c0 + 1;
    }
    else if ((*pcStack_c0 == '%') && (pcStack_c0[1] == 'c')) {
      if ((uint)cp < 0x29) {
        local_248 = (lua_Integer *)((long)(int)(uint)cp + (long)ap[0].overflow_arg_area);
        cp._0_4_ = (uint)cp + 8;
      }
      else {
        local_248 = (lua_Integer *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      i = *local_248;
      raviX_buffer_add_fstring(buf,"--%s",i);
      pcStack_c0 = pcStack_c0 + 1;
    }
    else if ((*pcStack_c0 == '%') && (pcStack_c0[1] == 'i')) {
      if ((uint)cp < 0x29) {
        local_260 = (double *)((long)(int)(uint)cp + (long)ap[0].overflow_arg_area);
        cp._0_4_ = (uint)cp + 8;
      }
      else {
        local_260 = (double *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      d = *local_260;
      raviX_buffer_add_longlong(buf,(int64_t)d);
      pcStack_c0 = pcStack_c0 + 1;
    }
    else if ((*pcStack_c0 == '%') && (pcStack_c0[1] == 'f')) {
      if (cp._4_4_ < 0xa1) {
        local_280 = (double *)((long)(int)cp._4_4_ + (long)ap[0].overflow_arg_area);
        cp._4_4_ = cp._4_4_ + 0x10;
      }
      else {
        local_280 = (double *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      i_1 = (lua_Integer)*local_280;
      raviX_buffer_add_double(buf,(double)i_1);
      pcStack_c0 = pcStack_c0 + 1;
    }
    else if ((*pcStack_c0 == '%') && (pcStack_c0[1] == 'b')) {
      if ((uint)cp < 0x29) {
        local_298 = (long *)((long)(int)(uint)cp + (long)ap[0].overflow_arg_area);
        cp._0_4_ = (uint)cp + 8;
      }
      else {
        local_298 = (long *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      p = (void *)*local_298;
      raviX_buffer_add_bool(buf,p != (void *)0x0);
      pcStack_c0 = pcStack_c0 + 1;
    }
    else if ((*pcStack_c0 == '%') && (pcStack_c0[1] == 'P')) {
      if ((uint)cp < 0x29) {
        local_2b0 = (undefined8 *)((long)(int)(uint)cp + (long)ap[0].overflow_arg_area);
        cp._0_4_ = (uint)cp + 8;
      }
      else {
        local_2b0 = (undefined8 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      local_110 = *local_2b0;
      raviX_buffer_add_fstring(buf,"%lld",local_110);
      pcStack_c0 = pcStack_c0 + 1;
    }
    else {
      raviX_buffer_add_char(buf,*pcStack_c0);
    }
  }
  return;
}

Assistant:

static void printf_buf(TextBuffer *buf, const char *format, ...)
{
	static const char *PADDING = "                                                                                ";
	char tbuf[128] = {0};
	va_list ap;
	const char *cp;
	va_start(ap, format);
	for (cp = format; *cp; cp++) {
		if (cp[0] == '%' && cp[1] == 'p') { /* padding */
			int level = va_arg(ap, int);
			snprintf(tbuf, sizeof tbuf, "%.*s", level, PADDING);
			raviX_buffer_add_string(buf, tbuf);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 't') { /* string_object */
			const StringObject *s = va_arg(ap, const StringObject *);
			raviX_buffer_add_string(buf, s->str);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'T') { /* VariableType */
			const VariableType *type;
			type = va_arg(ap, const VariableType *);
			if (type->type_code == RAVI_TUSERDATA) {
				const StringObject *s = type->type_name;
				if (s != NULL)
					raviX_buffer_add_string(buf, s->str);
				else
					raviX_buffer_add_string(buf, "userdata");
			} else {
				raviX_buffer_add_string(buf, raviX_get_type_name(type->type_code));
			}
			cp++;
		} else if (cp[0] == '%' && cp[1] == 's') { /* const char * */
			const char *s;
			s = va_arg(ap, const char *);
			raviX_buffer_add_string(buf, s);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'c') { /* comment */
			const char *s;
			s = va_arg(ap, const char *);
			raviX_buffer_add_fstring(buf, "--%s", s);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'i') { /* integer */
			lua_Integer i;
			i = va_arg(ap, lua_Integer);
			raviX_buffer_add_longlong(buf, i);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'f') { /* float */
			double d;
			d = va_arg(ap, double);
			raviX_buffer_add_fstring(buf, "%.16f", d);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'b') { /* boolean */
			lua_Integer i;
			i = va_arg(ap, lua_Integer);
			raviX_buffer_add_bool(buf, i != 0);
			cp++;
		} else if (cp[0] == '%' && cp[1] == 'P') { /* pointer */
			void* p;
			p = va_arg(ap, void *);
			raviX_buffer_add_fstring(buf, "%p", p);
			cp++;
		} else {
			raviX_buffer_add_char(buf, *cp);
		}
	}
	va_end(ap);
}